

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_2D_double(double *a,int ld,int *lo,int *hi)

{
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int j;
  int i;
  int local_28;
  int local_24;
  
  for (local_24 = *in_RDX; local_24 <= *in_RCX; local_24 = local_24 + 1) {
    for (local_28 = in_RDX[1]; local_28 <= in_RCX[1]; local_28 = local_28 + 1) {
      printf("%13f ",*(undefined8 *)(in_RDI + (long)(in_ESI * local_28 + local_24) * 8));
    }
    printf("\n");
  }
  return;
}

Assistant:

void print_2D_double(double *a, int ld, int *lo, int *hi)
{
int i,j;
     for(i=lo[0];i<=hi[0];i++){
       for(j=lo[1];j<=hi[1];j++) printf("%13f ",a[ld*j+i]);
       printf("\n");
     }
}